

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t gnu_add_sparse_entry(archive_read *a,tar *tar,int64_t offset,int64_t remaining)

{
  void *__s;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  archive *in_RDI;
  sparse_block *p;
  wchar_t local_4;
  
  __s = malloc(0x20);
  if (__s == (void *)0x0) {
    archive_set_error(in_RDI,0xc,"Out of memory");
    local_4 = L'\xffffffe2';
  }
  else {
    memset(__s,0,0x20);
    if (*(long *)(in_RSI + 0x140) == 0) {
      *(void **)(in_RSI + 0x138) = __s;
    }
    else {
      **(undefined8 **)(in_RSI + 0x140) = __s;
    }
    *(void **)(in_RSI + 0x140) = __s;
    *(undefined8 *)((long)__s + 8) = in_RDX;
    *(undefined8 *)((long)__s + 0x10) = in_RCX;
    local_4 = L'\0';
  }
  return local_4;
}

Assistant:

static int
gnu_add_sparse_entry(struct archive_read *a, struct tar *tar,
    int64_t offset, int64_t remaining)
{
	struct sparse_block *p;

	p = (struct sparse_block *)malloc(sizeof(*p));
	if (p == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	memset(p, 0, sizeof(*p));
	if (tar->sparse_last != NULL)
		tar->sparse_last->next = p;
	else
		tar->sparse_list = p;
	tar->sparse_last = p;
	p->offset = offset;
	p->remaining = remaining;
	return (ARCHIVE_OK);
}